

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

string * __thiscall
cmCTestVC::ComputeCommandLine_abi_cxx11_(string *__return_storage_ptr__,cmCTestVC *this,char **cmd)

{
  ostream **ppoVar1;
  size_t sVar2;
  char *pcVar3;
  string *psVar4;
  ostringstream line;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (this->_vptr_cmCTestVC != (_func_int **)0x0) {
    psVar4 = (string *)&this->CTest;
    pcVar3 = "";
    do {
      sVar2 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      pcVar3 = *(char **)((long)(psVar4 + -1) + 0x18);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar2 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      ppoVar1 = (ostream **)&psVar4->_M_dataplus;
      psVar4 = (string *)&psVar4->_M_string_length;
      pcVar3 = " ";
    } while (*ppoVar1 != (ostream *)0x0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::ComputeCommandLine(char const* const* cmd)
{
  std::ostringstream line;
  const char* sep = "";
  for (const char* const* arg = cmd; *arg; ++arg) {
    line << sep << "\"" << *arg << "\"";
    sep = " ";
  }
  return line.str();
}